

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xxhash.c
# Opt level: O2

XXH_errorcode XXH256_update(XXH256_state_t *state_in,void *input,size_t len)

{
  uint uVar1;
  ulong uVar2;
  long lVar3;
  long lVar4;
  long *plVar5;
  long lVar6;
  longlong lVar7;
  ulong uVar8;
  XXH_istate256_t *state;
  
  state_in->ll[0] = state_in->ll[0] + len;
  uVar1 = (uint)state_in->ll[0xe];
  uVar2 = (ulong)uVar1;
  if (uVar2 + len < 0x20) {
    memcpy((void *)((long)state_in->ll + uVar2 + 0x30),input,len);
    uVar2 = (ulong)(uint)((int)len + (int)state_in->ll[0xe]);
  }
  else {
    plVar5 = (long *)(len + (long)input);
    if (uVar2 != 0) {
      memcpy((void *)((long)state_in->ll + uVar2 + 0x30),input,(ulong)(0x20 - uVar1));
      uVar2 = state_in->ll[6] * -0x3d4d51c2d82b14b1 + state_in->ll[2];
      state_in->ll[2] = (uVar2 * 0x80000000 | uVar2 >> 0x21) * -0x61c8864e7a143579;
      uVar2 = state_in->ll[7] * -0x3d4d51c2d82b14b1 + state_in->ll[3];
      state_in->ll[3] = (uVar2 * 0x80000000 | uVar2 >> 0x21) * -0x61c8864e7a143579;
      uVar2 = state_in->ll[8] * -0x3d4d51c2d82b14b1 + state_in->ll[4];
      state_in->ll[4] = (uVar2 * 0x80000000 | uVar2 >> 0x21) * -0x61c8864e7a143579;
      uVar2 = state_in->ll[9] * -0x3d4d51c2d82b14b1 + state_in->ll[5];
      state_in->ll[5] = (uVar2 * 0x80000000 | uVar2 >> 0x21) * -0x61c8864e7a143579;
      input = (void *)((long)input + (ulong)(0x20 - (int)state_in->ll[0xe]));
      *(undefined4 *)(state_in->ll + 0xe) = 0;
    }
    if ((long *)((long)input + 0x20) <= plVar5) {
      lVar3 = state_in->ll[2];
      lVar4 = state_in->ll[3];
      lVar7 = state_in->ll[4];
      lVar6 = state_in->ll[5];
      do {
        uVar2 = *input * -0x3d4d51c2d82b14b1 + lVar3;
        lVar3 = (uVar2 * 0x80000000 | uVar2 >> 0x21) * -0x61c8864e7a143579;
        uVar2 = *(long *)((long)input + 8) * -0x3d4d51c2d82b14b1 + lVar4;
        uVar8 = *(long *)((long)input + 0x10) * -0x3d4d51c2d82b14b1 + lVar7;
        lVar4 = (uVar2 * 0x80000000 | uVar2 >> 0x21) * -0x61c8864e7a143579;
        lVar7 = (uVar8 * 0x80000000 | uVar8 >> 0x21) * -0x61c8864e7a143579;
        uVar2 = *(long *)((long)input + 0x18) * -0x3d4d51c2d82b14b1 + lVar6;
        lVar6 = (uVar2 * 0x80000000 | uVar2 >> 0x21) * -0x61c8864e7a143579;
        input = (void *)((long)input + 0x20);
      } while (input <= plVar5 + -4);
      state_in->ll[2] = lVar3;
      state_in->ll[3] = lVar4;
      state_in->ll[4] = lVar7;
      state_in->ll[5] = lVar6;
    }
    if (plVar5 <= input) {
      return XXH_OK;
    }
    uVar2 = (long)plVar5 - (long)input;
    memcpy(state_in->ll + 6,input,uVar2);
  }
  *(int *)(state_in->ll + 0xe) = (int)uVar2;
  return XXH_OK;
}

Assistant:

XXH_errorcode XXH256_update(XXH256_state_t *state_in, const void *input, size_t len) {
    XXH_endianess endian_detected = (XXH_endianess) XXH_CPU_LITTLE_ENDIAN;

    if ((endian_detected == XXH_littleEndian) || XXH_FORCE_NATIVE_FORMAT)
        return XXH256_update_endian(state_in, input, len, XXH_littleEndian);
    else
        return XXH256_update_endian(state_in, input, len, XXH_bigEndian);
}